

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Log.cpp
# Opt level: O0

void __thiscall Log::update_individual_log(Log *this)

{
  bool bVar1;
  ulong uVar2;
  size_type sVar3;
  reference ppGVar4;
  reference ppPVar5;
  reference pbVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2e8;
  string local_2c8 [8];
  string s;
  iterator __end1;
  iterator __begin1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  string local_270;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_250;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_230;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_210;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f0;
  int local_1cc;
  undefined1 local_1c8 [4];
  int j;
  int local_1a4;
  undefined1 local_1a0 [4];
  int i;
  string graph_string;
  string local_160;
  string local_140;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  undefined1 local_30 [8];
  string log;
  Log *this_local;
  
  log.field_2._8_8_ = this;
  std::operator+(&local_110,"Label:\t\t",&this->label);
  std::operator+(&local_f0,&local_110,"\nTotal:\t\t");
  std::__cxx11::to_string(&local_140,this->total);
  std::operator+(&local_d0,&local_f0,&local_140);
  std::operator+(&local_b0,&local_d0,"\nAverage:\t");
  std::__cxx11::to_string(&local_160,this->average);
  std::operator+(&local_90,&local_b0,&local_160);
  std::operator+(&local_70,&local_90," seconds\nLast:\t\t");
  std::__cxx11::to_string((string *)((long)&graph_string.field_2 + 8),this->last);
  std::operator+(&local_50,&local_70,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&graph_string.field_2 + 8));
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_30,
                 &local_50," seconds");
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)(graph_string.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_160);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::~string((string *)&local_d0);
  std::__cxx11::string::~string((string *)&local_140);
  std::__cxx11::string::~string((string *)&local_f0);
  std::__cxx11::string::~string((string *)&local_110);
  std::__cxx11::string::string((string *)local_1a0);
  std::__cxx11::string::operator+=((string *)local_30,"\nGraphs:\t");
  local_1a4 = 0;
  while( true ) {
    uVar2 = (ulong)local_1a4;
    sVar3 = std::vector<Graph_*,_std::allocator<Graph_*>_>::size(&this->graphs);
    if (sVar3 <= uVar2) break;
    std::operator<<((ostream *)&std::cout,"\n");
    ppGVar4 = std::vector<Graph_*,_std::allocator<Graph_*>_>::operator[]
                        (&this->graphs,(long)local_1a4);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1c8,
                   &(*ppGVar4)->label,":\t");
    std::__cxx11::string::operator+=((string *)local_1a0,(string *)local_1c8);
    std::__cxx11::string::~string((string *)local_1c8);
    local_1cc = 0;
    while( true ) {
      uVar2 = (ulong)local_1cc;
      ppGVar4 = std::vector<Graph_*,_std::allocator<Graph_*>_>::operator[]
                          (&this->graphs,(long)local_1a4);
      sVar3 = std::vector<Point_*,_std::allocator<Point_*>_>::size(&(*ppGVar4)->points);
      if (sVar3 <= uVar2) break;
      ppGVar4 = std::vector<Graph_*,_std::allocator<Graph_*>_>::operator[]
                          (&this->graphs,(long)local_1a4);
      ppPVar5 = std::vector<Point_*,_std::allocator<Point_*>_>::operator[]
                          (&(*ppGVar4)->points,(long)local_1cc);
      std::__cxx11::to_string(&local_270,(*ppPVar5)->x);
      std::operator+(&local_250,"(",&local_270);
      std::operator+(&local_230,&local_250,",");
      ppGVar4 = std::vector<Graph_*,_std::allocator<Graph_*>_>::operator[]
                          (&this->graphs,(long)local_1a4);
      ppPVar5 = std::vector<Point_*,_std::allocator<Point_*>_>::operator[]
                          (&(*ppGVar4)->points,(long)local_1cc);
      std::__cxx11::to_string((string *)&__range1,(*ppPVar5)->y);
      std::operator+(&local_210,&local_230,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&__range1)
      ;
      std::operator+(&local_1f0,&local_210,"),");
      std::__cxx11::string::operator+=((string *)local_1a0,(string *)&local_1f0);
      std::__cxx11::string::~string((string *)&local_1f0);
      std::__cxx11::string::~string((string *)&local_210);
      std::__cxx11::string::~string((string *)&__range1);
      std::__cxx11::string::~string((string *)&local_230);
      std::__cxx11::string::~string((string *)&local_250);
      std::__cxx11::string::~string((string *)&local_270);
      local_1cc = local_1cc + 1;
    }
    local_1a4 = local_1a4 + 1;
  }
  std::__cxx11::string::operator+=((string *)local_30,"\nRaw Text\n");
  __end1 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin(&this->rawText);
  s.field_2._8_8_ =
       std::
       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::end(&this->rawText);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                *)((long)&s.field_2 + 8));
    if (!bVar1) break;
    pbVar6 = __gnu_cxx::
             __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator*(&__end1);
    std::__cxx11::string::string(local_2c8,(string *)pbVar6);
    std::__cxx11::string::operator+=((string *)local_30,local_2c8);
    std::__cxx11::string::~string(local_2c8);
    __gnu_cxx::
    __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&__end1);
  }
  std::operator+(&local_2e8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_30,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a0);
  std::__cxx11::string::operator=((string *)local_30,(string *)&local_2e8);
  std::__cxx11::string::~string((string *)&local_2e8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&records_abi_cxx11_,(value_type *)local_30);
  std::__cxx11::string::~string((string *)local_1a0);
  std::__cxx11::string::~string((string *)local_30);
  return;
}

Assistant:

void Log::update_individual_log() {
    std::string log =
            "Label:\t\t" + label + "\nTotal:\t\t" + std::to_string(total) + "\nAverage:\t" + std::to_string(average) +
            " seconds\nLast:\t\t"
            + std::to_string(last) + " seconds";
    std::string graph_string;
    log += "\nGraphs:\t";
    for (int i = 0; i < graphs.size(); i++) {
        std::cout << "\n";
        graph_string += graphs[i]->label + ":\t";
        for (int j = 0; j < graphs[i]->points.size(); j++) {
            graph_string +=
                    "(" + std::to_string(graphs[i]->points[j]->x) + "," + std::to_string(graphs[i]->points[j]->y) + "),";
        }


    }

    log+= "\nRaw Text\n";
    for(std::string s : rawText)
    {
        log+= s;
    }
    log = log + graph_string;

    Log::records.push_back(log);
}